

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginComboPreview(void)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImVec2 IVar3;
  ImVec2 *unaff_retaddr;
  ImGuiComboPreviewData *preview_data;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffffd8;
  ImGuiContext *pIVar4;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar5;
  undefined1 intersect_with_current_clip_rect;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if (((pIVar1->SkipItems & 1U) == 0) && (((GImGui->LastItemData).StatusFlags & 0x100U) != 0)) {
    pIVar4 = GImGui;
    bVar5 = ImRect::Overlaps(&pIVar1->ClipRect,&(GImGui->ComboPreviewData).PreviewRect);
    intersect_with_current_clip_rect = (undefined1)((ulong)pIVar4 >> 0x38);
    if (bVar5) {
      (pIVar2->ComboPreviewData).BackupCursorPos = (pIVar1->DC).CursorPos;
      (pIVar2->ComboPreviewData).BackupCursorMaxPos = (pIVar1->DC).CursorMaxPos;
      (pIVar2->ComboPreviewData).BackupCursorPosPrevLine = (pIVar1->DC).CursorPosPrevLine;
      (pIVar2->ComboPreviewData).BackupPrevLineTextBaseOffset = (pIVar1->DC).PrevLineTextBaseOffset;
      (pIVar2->ComboPreviewData).BackupLayout = (pIVar1->DC).LayoutType;
      IVar3 = ::operator+(in_stack_ffffffffffffffd8,(ImVec2 *)0x258c84);
      (pIVar1->DC).CursorPos = IVar3;
      (pIVar1->DC).CursorMaxPos = (pIVar1->DC).CursorPos;
      (pIVar1->DC).LayoutType = 0;
      (pIVar1->DC).IsSameLine = false;
      PushClipRect(unaff_retaddr,
                   (ImVec2 *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                   (bool)intersect_with_current_clip_rect);
      bVar5 = true;
    }
    else {
      bVar5 = false;
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGui::BeginComboPreview()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiComboPreviewData* preview_data = &g.ComboPreviewData;

    if (window->SkipItems || !(g.LastItemData.StatusFlags & ImGuiItemStatusFlags_Visible))
        return false;
    IM_ASSERT(g.LastItemData.Rect.Min.x == preview_data->PreviewRect.Min.x && g.LastItemData.Rect.Min.y == preview_data->PreviewRect.Min.y); // Didn't call after BeginCombo/EndCombo block or forgot to pass ImGuiComboFlags_CustomPreview flag?
    if (!window->ClipRect.Overlaps(preview_data->PreviewRect)) // Narrower test (optional)
        return false;

    // FIXME: This could be contained in a PushWorkRect() api
    preview_data->BackupCursorPos = window->DC.CursorPos;
    preview_data->BackupCursorMaxPos = window->DC.CursorMaxPos;
    preview_data->BackupCursorPosPrevLine = window->DC.CursorPosPrevLine;
    preview_data->BackupPrevLineTextBaseOffset = window->DC.PrevLineTextBaseOffset;
    preview_data->BackupLayout = window->DC.LayoutType;
    window->DC.CursorPos = preview_data->PreviewRect.Min + g.Style.FramePadding;
    window->DC.CursorMaxPos = window->DC.CursorPos;
    window->DC.LayoutType = ImGuiLayoutType_Horizontal;
    window->DC.IsSameLine = false;
    PushClipRect(preview_data->PreviewRect.Min, preview_data->PreviewRect.Max, true);

    return true;
}